

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

void __thiscall Assembler::printSymbolTable(Assembler *this)

{
  long lVar1;
  char cVar2;
  ostream oVar3;
  ostream *poVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  char *pcVar8;
  ostream *poVar9;
  ofstream file;
  undefined1 auStack_238 [8];
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  uint auStack_218 [50];
  char acStack_150 [24];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)&this->outputFileName,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Symbol table:",0xd);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"Value\tType\tSection\t\tName\t\tId\t\tSize",0x22);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  p_Var6 = (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var7) {
    do {
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
      lVar1 = *(long *)(local_230 + -0x18);
      if (acStack_150[lVar1 + 1] == '\0') {
        cVar2 = std::ios::widen((char)auStack_238 + (char)lVar1 + '\b');
        acStack_150[lVar1] = cVar2;
        acStack_150[lVar1 + 1] = '\x01';
      }
      acStack_150[lVar1] = '0';
      *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&local_230,*(int *)&p_Var6[3].field_0x4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      pcVar8 = "g\t";
      if (*(char *)&p_Var6[3]._M_parent == '\0') {
        pcVar8 = "l\t";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,2);
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
      *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,p_Var6[3]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar9 = poVar4 + *(long *)(*(long *)poVar4 + -0x18);
      if (poVar4[*(long *)(*(long *)poVar4 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar9);
        poVar9[0xe0] = oVar3;
        poVar9[0xe1] = (ostream)0x1;
      }
      poVar9[0xe0] = (ostream)0x20;
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar9 = poVar4 + *(long *)(*(long *)poVar4 + -0x18);
      if (poVar4[*(long *)(*(long *)poVar4 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar9);
        poVar9[0xe0] = oVar3;
        poVar9[0xe1] = (ostream)0x1;
      }
      poVar9[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)*(ushort *)&p_Var6[3]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
      *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
      lVar1 = *(long *)(local_230 + -0x18);
      if (acStack_150[lVar1 + 1] == '\0') {
        cVar2 = std::ios::widen((char)auStack_238 + (char)lVar1 + '\b');
        acStack_150[lVar1] = cVar2;
        acStack_150[lVar1 + 1] = '\x01';
      }
      acStack_150[lVar1] = '0';
      plVar5 = (long *)std::ostream::operator<<
                                 ((ostream *)&local_230,*(int *)((long)&p_Var6[3]._M_parent + 4));
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Assembler::printSymbolTable() {
    ofstream file(this->outputFileName);

    file << "Symbol table:" << endl;
    file << "Value\tType\tSection\t\tName\t\tId\t\tSize" << endl;
    for (auto &entry: symbolTable) {
        file << dec << setfill('0') << setw(8) << entry.second.value << "\t";
        //file << hex << setfill('0') << setw(8) << (0xffff & entry.second.value) << "\t";

        if (entry.second.isGlobal == false)
            file << "l\t";
        else {
            file << "g\t";
        }
        file << dec << setw(8) << entry.second.section << "\t" << setfill(' ') << setw(8) << entry.second.symbolName
             << "\t"
             << setfill('0')
             << setw(8) << (0xffff & entry.second.id) << "\t";
        file << dec << setw(8) << setfill('0') << entry.second.size << endl;
    }
    file << dec << endl;


}